

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * unixNextSystemCall(sqlite3_vfs *p,char *zName)

{
  int iVar1;
  int local_24;
  int i;
  char *zName_local;
  sqlite3_vfs *p_local;
  
  local_24 = -1;
  if (zName != (char *)0x0) {
    local_24 = 0;
    while ((local_24 < 0x17 && (iVar1 = strcmp(zName,aSyscall[local_24].zName), iVar1 != 0))) {
      local_24 = local_24 + 1;
    }
  }
  do {
    local_24 = local_24 + 1;
    if (0x17 < local_24) {
      return (char *)0x0;
    }
  } while (aSyscall[local_24].pCurrent == (sqlite3_syscall_ptr)0x0);
  return aSyscall[local_24].zName;
}

Assistant:

static const char *unixNextSystemCall(sqlite3_vfs *p, const char *zName){
  int i = -1;

  UNUSED_PARAMETER(p);
  if( zName ){
    for(i=0; i<ArraySize(aSyscall)-1; i++){
      if( strcmp(zName, aSyscall[i].zName)==0 ) break;
    }
  }
  for(i++; i<ArraySize(aSyscall); i++){
    if( aSyscall[i].pCurrent!=0 ) return aSyscall[i].zName;
  }
  return 0;
}